

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces_tests.cpp
# Opt level: O0

void __thiscall interfaces_tests::findAncestorByHash::test_method(findAncestorByHash *this)

{
  bool bVar1;
  int iVar2;
  pointer pCVar3;
  FoundBlock *pFVar4;
  long in_FS_OFFSET;
  CChain *active;
  unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *chain;
  int height;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock17;
  ChainstateManager *in_stack_fffffffffffffc58;
  lazy_ostream *in_stack_fffffffffffffc60;
  CBlockIndex *in_stack_fffffffffffffc68;
  CChain *in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc78;
  int in_stack_fffffffffffffc7c;
  lazy_ostream *in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc8c;
  CBlockIndex *in_stack_fffffffffffffc90;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_fffffffffffffc98;
  lazy_ostream local_268 [2];
  assertion_result local_248 [2];
  undefined1 local_208 [16];
  undefined1 local_1f8 [64];
  const_string local_1b8 [2];
  lazy_ostream local_198 [2];
  assertion_result local_178 [2];
  undefined4 local_13c;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined1 local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  undefined1 local_48 [32];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
             (char *)in_stack_fffffffffffffc80,
             (char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffffc58);
  ChainstateManager::GetMutex(in_stack_fffffffffffffc58);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffc58);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffffc98,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffc90,
             (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
             (char *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,
             SUB41((uint)in_stack_fffffffffffffc78 >> 0x18,0));
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
             (char *)in_stack_fffffffffffffc80,
             (char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffffc58);
  ChainstateManager::ActiveChain(in_stack_fffffffffffffc58);
  local_13c = 0xffffffff;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc68,
               (pointer)in_stack_fffffffffffffc60,(unsigned_long)in_stack_fffffffffffffc58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc98,
               (const_string *)in_stack_fffffffffffffc90,
               CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
               (const_string *)in_stack_fffffffffffffc80);
    pCVar3 = std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::operator->
                       ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                        in_stack_fffffffffffffc58);
    CChain::operator[](in_stack_fffffffffffffc70,(int)((ulong)in_stack_fffffffffffffc68 >> 0x20));
    CBlockIndex::GetBlockHash(in_stack_fffffffffffffc68);
    CChain::operator[](in_stack_fffffffffffffc70,(int)((ulong)in_stack_fffffffffffffc68 >> 0x20));
    CBlockIndex::GetBlockHash(in_stack_fffffffffffffc68);
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    local_c8 = 0;
    uStack_c0 = 0;
    local_d8 = 0;
    uStack_d0 = 0;
    local_e8 = 0;
    uStack_e0 = 0;
    interfaces::FoundBlock::FoundBlock((FoundBlock *)in_stack_fffffffffffffc58);
    pFVar4 = interfaces::FoundBlock::height
                       ((FoundBlock *)in_stack_fffffffffffffc68,(int *)in_stack_fffffffffffffc60);
    (*pCVar3->_vptr_Chain[0xd])(pCVar3,local_28,local_48,pFVar4);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffc68,
               SUB81((ulong)in_stack_fffffffffffffc60 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc68,
               (pointer)in_stack_fffffffffffffc60,(unsigned_long)in_stack_fffffffffffffc58);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffc60,(basic_cstring<const_char> *)in_stack_fffffffffffffc58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc68,
               (pointer)in_stack_fffffffffffffc60,(unsigned_long)in_stack_fffffffffffffc58);
    in_stack_fffffffffffffc58 = (ChainstateManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_178,local_198,local_1b8,0x5d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffc58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc68,
               (pointer)in_stack_fffffffffffffc60,(unsigned_long)in_stack_fffffffffffffc58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc98,
               (const_string *)in_stack_fffffffffffffc90,
               CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
               (const_string *)in_stack_fffffffffffffc80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc60,(char (*) [1])in_stack_fffffffffffffc58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc68,
               (pointer)in_stack_fffffffffffffc60,(unsigned_long)in_stack_fffffffffffffc58);
    in_stack_fffffffffffffc68 = (CBlockIndex *)0x1bf5f53;
    in_stack_fffffffffffffc60 = (lazy_ostream *)&stack0xfffffffffffffdf4;
    in_stack_fffffffffffffc58 = (ChainstateManager *)0x1d26d6a;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_1f8,local_208,0x5e,1,2,&local_13c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc68,
               (pointer)in_stack_fffffffffffffc60,(unsigned_long)in_stack_fffffffffffffc58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc98,
               (const_string *)in_stack_fffffffffffffc90,
               CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
               (const_string *)in_stack_fffffffffffffc80);
    in_stack_fffffffffffffc98 =
         (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
         std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::operator->
                   ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                    in_stack_fffffffffffffc58);
    CChain::operator[](in_stack_fffffffffffffc70,(int)((ulong)in_stack_fffffffffffffc68 >> 0x20));
    CBlockIndex::GetBlockHash(in_stack_fffffffffffffc68);
    in_stack_fffffffffffffc90 =
         CChain::operator[](in_stack_fffffffffffffc70,
                            (int)((ulong)in_stack_fffffffffffffc68 >> 0x20));
    CBlockIndex::GetBlockHash(in_stack_fffffffffffffc68);
    local_138 = 0;
    local_130 = 0;
    local_128 = 0;
    local_120 = 0;
    local_118 = 0;
    local_110 = 0;
    local_108 = 0;
    local_100 = 0;
    local_f8 = 0;
    local_f0 = 0;
    iVar2 = (**(_func_int **)
               ((long)&(in_stack_fffffffffffffc98->super_unique_lock)._M_device[2].
                       super___recursive_mutex_base._M_mutex + 0x18))
                      (in_stack_fffffffffffffc98,local_68,local_88,&local_138);
    in_stack_fffffffffffffc8c = CONCAT13((char)iVar2,(int3)in_stack_fffffffffffffc8c);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffc68,
               SUB81((ulong)in_stack_fffffffffffffc60 >> 0x38,0));
    in_stack_fffffffffffffc80 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc68,
               (pointer)in_stack_fffffffffffffc60,(unsigned_long)in_stack_fffffffffffffc58);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffc60,(basic_cstring<const_char> *)in_stack_fffffffffffffc58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc68,
               (pointer)in_stack_fffffffffffffc60,(unsigned_long)in_stack_fffffffffffffc58);
    in_stack_fffffffffffffc58 = (ChainstateManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_248,local_268,(const_string *)&stack0xfffffffffffffd78,0x5f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffc58);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffc58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(findAncestorByHash)
{
    LOCK(Assert(m_node.chainman)->GetMutex());
    auto& chain = m_node.chain;
    const CChain& active = Assert(m_node.chainman)->ActiveChain();
    int height = -1;
    BOOST_CHECK(chain->findAncestorByHash(active[20]->GetBlockHash(), active[10]->GetBlockHash(), FoundBlock().height(height)));
    BOOST_CHECK_EQUAL(height, 10);
    BOOST_CHECK(!chain->findAncestorByHash(active[10]->GetBlockHash(), active[20]->GetBlockHash()));
}